

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_func.cpp
# Opt level: O1

unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
 __thiscall
pfederc::Parser::fromExprDeclToFunctionParam
          (Parser *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guard,
          unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *guardResult)

{
  Expr *pEVar1;
  long *plVar2;
  _Alloc_hider _Var3;
  istream *piVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined8 extraout_RAX;
  Lexer *pLVar7;
  long lVar8;
  Lexer *pLVar9;
  pointer __p;
  undefined8 *in_R8;
  Parser *this_00;
  undefined1 uVar10;
  size_type sVar11;
  unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> unopexpr;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_58;
  undefined4 local_4c;
  size_type local_48;
  undefined1 local_40 [16];
  
  pLVar9 = (Lexer *)(guard->_M_t).
                    super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
                    super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                    super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  if (*(ExprType *)&pLVar9->filePath == EXPR_UNOP) {
    if (pLVar9->_vptr_Lexer != (_func_int **)&PTR__UnOpExpr_001289c0) {
      __cxa_bad_cast();
    }
    if (*(short *)((pLVar9->fileContent)._M_dataplus._M_p + 0x10) == 0x5b) {
      (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
      super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
      pEVar1 = (Expr *)(pLVar9->fileContent)._M_string_length;
      (pLVar9->fileContent)._M_string_length = 0;
      local_58._M_head_impl = (Expr *)pLVar9;
      std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)&local_58
                );
      uVar10 = 1;
      pLVar9 = (Lexer *)pEVar1;
      goto LAB_001127a0;
    }
  }
  else if (*(ExprType *)&pLVar9->filePath == EXPR_BIOP) {
    if (pLVar9->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_00128998) {
      __cxa_bad_cast();
    }
    if (*(short *)&((Expr *)&pLVar9->fileContent)->parent == 0x53) {
      if (pLVar9->_vptr_Lexer != (_func_int **)&PTR__BiOpExpr_00128998) goto LAB_001129a9;
      pLVar7 = ((Expr *)&pLVar9->fileContent)->lexer;
      if (*(int *)&(pLVar7->filePath)._M_dataplus._M_p == 0x13) {
        if (pLVar7->_vptr_Lexer != (_func_int **)&PTR__UnOpExpr_001289c0) {
          __cxa_bad_cast();
        }
        if (*(short *)((pLVar7->fileContent)._M_dataplus._M_p + 0x10) != 0x45) goto LAB_001127e2;
        local_58._M_head_impl = (Expr *)((Expr *)&pLVar9->fileContent)->lexer;
        (pLVar9->fileContent).field_2._M_allocated_capacity = 0;
        sVar11 = (((Lexer *)local_58._M_head_impl)->fileContent)._M_string_length;
        (((Lexer *)local_58._M_head_impl)->fileContent)._M_string_length = 0;
        std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)
                   &local_58);
        uVar6 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      else {
LAB_001127e2:
        sVar11 = (pLVar9->fileContent).field_2._M_allocated_capacity;
        (pLVar9->fileContent).field_2._M_allocated_capacity = 0;
        uVar6 = 0;
      }
      if (*(int *)(sVar11 + 0x18) == 0) {
        local_4c = uVar6;
        lVar8 = __dynamic_cast(sVar11,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (lVar8 == 0) goto LAB_001129a9;
        bVar5 = Token::operator==(*(Token **)(lVar8 + 0x38),TOK_ID);
        if (!bVar5) goto LAB_001128a9;
        plVar2 = *(long **)((long)(pLVar9->fileContent).field_2._M_local_buf + 8);
        if ((int)plVar2[3] == 0x13) {
          if ((undefined **)*plVar2 != &PTR__UnOpExpr_001289c0) {
            __cxa_bad_cast();
          }
          if (*(short *)(plVar2[7] + 0x10) == 0x45) {
            local_58._M_head_impl = (Expr *)operator_new(0x38);
            pEVar1 = (Expr *)plVar2[4];
            pLVar9 = (Lexer *)plVar2[5];
            _Var3._M_p = (pointer)plVar2[6];
            *(undefined2 *)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer = 2;
            *(undefined4 *)((long)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer + 4) = 7;
            *(Expr **)&((Lexer *)local_58._M_head_impl)->cfg = pEVar1;
            ((Lexer *)local_58._M_head_impl)->input = (istream *)pLVar9;
            (((Lexer *)local_58._M_head_impl)->filePath)._M_dataplus._M_p = _Var3._M_p;
            ((Position *)&(((Lexer *)local_58._M_head_impl)->filePath)._M_string_length)->line = 0;
            (((Lexer *)local_58._M_head_impl)->filePath).field_2._M_allocated_capacity = 0;
            *(size_t *)((long)&(((Lexer *)local_58._M_head_impl)->filePath).field_2 + 8) = 0;
            this_00 = (Parser *)local_40;
            goto LAB_001128ea;
          }
        }
        lVar8 = __dynamic_cast(sVar11,&Expr::typeinfo,&TokenExpr::typeinfo,0);
        if (lVar8 == 0) {
LAB_001129a9:
          __cxa_bad_cast();
        }
        local_48 = *(size_type *)(lVar8 + 0x38);
        piVar4 = *(istream **)((long)(pLVar9->fileContent).field_2._M_local_buf + 8);
        *(undefined8 *)((long)(pLVar9->fileContent).field_2._M_local_buf + 8) = 0;
        pLVar9 = (Lexer *)operator_new(0x28);
        pLVar9->_vptr_Lexer = (_func_int **)*in_R8;
        *in_R8 = 0;
        *(Expr **)&(pLVar9->cfg).multiLineString =
             (guardResult->_M_t).
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        (guardResult->_M_t).
        super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
        super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
        super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
        pLVar9->input = piVar4;
        *(char *)&(pLVar9->filePath)._M_dataplus._M_p = (char)local_4c;
        (pLVar9->filePath)._M_string_length = local_48;
      }
      else {
LAB_001128a9:
        local_58._M_head_impl = (Expr *)operator_new(0x38);
        pEVar1 = *(Expr **)(sVar11 + 0x20);
        pLVar9 = *(Lexer **)(sVar11 + 0x28);
        _Var3._M_p = *(pointer *)(sVar11 + 0x30);
        *(undefined2 *)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer = 2;
        *(undefined4 *)((long)&((Lexer *)local_58._M_head_impl)->_vptr_Lexer + 4) = 6;
        *(Expr **)&((Lexer *)local_58._M_head_impl)->cfg = pEVar1;
        ((Lexer *)local_58._M_head_impl)->input = (istream *)pLVar9;
        (((Lexer *)local_58._M_head_impl)->filePath)._M_dataplus._M_p = _Var3._M_p;
        ((Position *)&(((Lexer *)local_58._M_head_impl)->filePath)._M_string_length)->line = 0;
        (((Lexer *)local_58._M_head_impl)->filePath).field_2._M_allocated_capacity = 0;
        *(size_t *)((long)&(((Lexer *)local_58._M_head_impl)->filePath).field_2 + 8) = 0;
        this_00 = (Parser *)(local_40 + 8);
LAB_001128ea:
        generateError(this_00,(unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                               *)expr);
        std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                  ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                   this_00);
        if ((Lexer *)local_58._M_head_impl != (Lexer *)0x0) {
          std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                    ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_58,
                     (Error<pfederc::SyntaxErrorCode> *)local_58._M_head_impl);
        }
        this->lexer = (Lexer *)0x0;
        pLVar9 = (Lexer *)0x0;
      }
      this->lexer = pLVar9;
      if (sVar11 == 0) {
        return (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                )this;
      }
      (**(code **)(*(long *)sVar11 + 8))(sVar11);
      return (unique_ptr<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
              )this;
    }
  }
  (guard->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  uVar10 = 0;
LAB_001127a0:
  pLVar7 = (Lexer *)operator_new(0x28);
  pLVar7->_vptr_Lexer = (_func_int **)*in_R8;
  *in_R8 = 0;
  *(Expr **)&(pLVar7->cfg).multiLineString =
       (guardResult->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>
       ._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  (guardResult->_M_t).super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t
  .super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  pLVar7->input = (istream *)pLVar9;
  *(undefined1 *)&(pLVar7->filePath)._M_dataplus._M_p = uVar10;
  (pLVar7->filePath)._M_string_length = 0;
  this->lexer = pLVar7;
  return (__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
          )(__uniq_ptr_data<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>,_std::default_delete<std::tuple<const_pfederc::Token_*,_bool,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FuncParameter> Parser::fromExprDeclToFunctionParam(
    std::unique_ptr<Expr> &&expr, std::unique_ptr<Expr> &&guard,
    std::unique_ptr<Expr> &&guardResult) noexcept {
  // '&'id ':' expr | id ':' expr | '&' expr | expr
  if (isBiOpExpr(*expr, TokenType::TOK_OP_DCL)) {
    // '&'id ':' expr | id ':' expr
    BiOpExpr &biopdcl = dynamic_cast<BiOpExpr&>(*expr);

    std::unique_ptr<Expr> idexpr;
    bool ismutable;
    if (isUnOpExpr(biopdcl.getLeft(), TokenType::TOK_OP_BAND)) {
      std::unique_ptr<UnOpExpr> unopexpr =
          std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(biopdcl.getLeftPtr().release()));
      ismutable = true;
      idexpr = unopexpr->getExpressionPtr();
    } else {
      idexpr = biopdcl.getLeftPtr();
      ismutable = false;
    }

    if (!isTokenExpr(*idexpr, TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL_ID, idexpr->getPosition()));
      return nullptr;
    }

    if (isUnOpExpr(biopdcl.getRight(), TokenType::TOK_OP_BAND)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_INVALID_VARDECL, biopdcl.getRight().getPosition()));
      return nullptr;
    }

    return std::make_unique<FuncParameter>(
      &dynamic_cast<const TokenExpr&>(*idexpr).getToken(),
      ismutable,
      biopdcl.getRightPtr(),
      std::move(guard), std::move(guardResult));
  }
  // '&' expr | expr
  std::unique_ptr<Expr> typeexpr;
  bool ismutable;
  if (isUnOpExpr(*expr, TokenType::TOK_OP_MUT)) {
    std::unique_ptr<UnOpExpr> unopexpr =
      std::unique_ptr<UnOpExpr>(dynamic_cast<UnOpExpr*>(expr.release()));
    typeexpr = unopexpr->getExpressionPtr();
    ismutable = true;
  } else {
    typeexpr = std::move(expr);
    ismutable = false;
  }

  return std::make_unique<FuncParameter>(
    nullptr, ismutable, std::move(typeexpr),
    std::move(guard), std::move(guardResult));
}